

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O1

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  
  lVar19 = N_VGetArrayPointer();
  lVar20 = N_VGetArrayPointer();
  dVar17 = sin(t * *(double *)((long)user_data + 0x968));
  dVar31 = 0.0;
  if (dVar17 <= 0.0) {
    *(undefined8 *)((long)user_data + 0x960) = 0;
  }
  else {
    dVar31 = exp(-22.62 / dVar17);
    dVar17 = exp(-7.601 / dVar17);
    *(double *)((long)user_data + 0x960) = dVar17;
    dVar31 = dVar31 * 3.7e+16;
  }
  dVar17 = *(double *)((long)user_data + 0x960);
  dVar5 = *(double *)((long)user_data + 0x978);
  dVar6 = *(double *)((long)user_data + 0x990);
  dVar7 = *(double *)((long)user_data + 0x980);
  dVar8 = *(double *)((long)user_data + 0x988);
  lVar1 = lVar19 + 8;
  lVar20 = lVar20 + 8;
  lVar27 = 0;
  lVar21 = lVar1;
  do {
    iVar26 = (int)lVar27;
    dVar18 = ((double)iVar26 + -0.5) * dVar5 + 30.0;
    dVar32 = exp(dVar18 * 0.2);
    dVar18 = exp((dVar5 + dVar18) * 0.2);
    dVar18 = dVar18 * dVar6;
    dVar32 = dVar32 * -dVar6;
    lVar2 = lVar19 + lVar27 * 0xa0;
    lVar3 = lVar1 + (long)(int)((iVar26 + (uint)(lVar27 != 9) * 2) * 0x14 + -0x14) * 8;
    lVar4 = lVar1 + (long)(int)(((-(uint)(lVar27 != 0) | 1) + iVar26) * 0x14) * 8;
    lVar22 = 0;
    iVar23 = 0;
    do {
      dVar9 = *(double *)(lVar21 + -8 + lVar22);
      dVar10 = *(double *)(lVar21 + lVar22);
      dVar28 = dVar9 * 1.63e-16 * 3.7e+16;
      dVar29 = dVar9 * 4.66e-16 * dVar10;
      dVar30 = dVar17 * dVar10;
      dVar11 = *(double *)(lVar3 + lVar22);
      dVar12 = *(double *)(lVar4 + lVar22);
      iVar25 = iVar23 + (uint)(lVar22 != 0x90) * 2;
      iVar24 = (-(uint)(lVar22 != 0) | 1) + iVar23;
      dVar13 = *(double *)(lVar2 + (long)(iVar24 * 2) * 8);
      dVar14 = *(double *)(lVar2 + (long)(iVar25 * 2 + -2) * 8);
      dVar15 = *(double *)(lVar19 + (long)(iVar26 * 0x14 + -1 + iVar25 * 2) * 8);
      dVar16 = *(double *)(lVar19 + (long)(iVar26 * 0x14 + 1 + iVar24 * 2) * 8);
      *(double *)(lVar20 + -8 + lVar22) =
           (dVar14 - dVar13) * dVar8 +
           ((dVar14 - (dVar9 + dVar9)) + dVar13) * dVar7 +
           (*(double *)(lVar3 + -8 + lVar22) - dVar9) * dVar18 +
           (dVar9 - *(double *)(lVar4 + -8 + lVar22)) * dVar32 +
           dVar31 + dVar31 + (-dVar28 - dVar29) + dVar30;
      *(double *)(lVar20 + lVar22) =
           (dVar15 - dVar16) * dVar8 +
           ((dVar15 - (dVar10 + dVar10)) + dVar16) * dVar7 +
           (dVar11 - dVar10) * dVar18 + (dVar10 - dVar12) * dVar32 + ((dVar28 - dVar29) - dVar30);
      iVar23 = iVar23 + 1;
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0xa0);
    lVar27 = lVar27 + 1;
    lVar20 = lVar20 + 0xa0;
    lVar21 = lVar21 + 0xa0;
  } while (lVar27 != 10);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype q3, c1, c2, c1dn, c2dn, c1up, c2up, c1lt, c2lt;
  sunrealtype c1rt, c2rt, cydn, cyup, hord1, hord2, horad1, horad2;
  sunrealtype qq1, qq2, qq3, qq4, rkin1, rkin2, s, vertd1, vertd2, ydn, yup;
  sunrealtype q4coef, dely, verdco, hordco, horaco;
  sunrealtype *udata, *dudata;
  int jx, jy, idn, iup, ileft, iright;
  UserData data;

  data   = (UserData)user_data;
  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO)
  {
    q3       = exp(-A3 / s);
    data->q4 = exp(-A4 / s);
  }
  else
  {
    q3       = ZERO;
    data->q4 = ZERO;
  }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  dely   = data->dy;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jy = 0; jy < MY; jy++)
  {
    /* Set vertical diffusion coefficients at jy +- 1/2 */

    ydn  = YMIN + (jy - SUN_RCONST(0.5)) * dely;
    yup  = ydn + dely;
    cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
    cyup = verdco * exp(SUN_RCONST(0.2) * yup);
    idn  = (jy == 0) ? 1 : -1;
    iup  = (jy == MY - 1) ? -1 : 1;
    for (jx = 0; jx < MX; jx++)
    {
      /* Extract c1 and c2, and set kinetic rate terms. */

      c1    = IJKth(udata, 1, jx, jy);
      c2    = IJKth(udata, 2, jx, jy);
      qq1   = Q1 * c1 * C3;
      qq2   = Q2 * c1 * c2;
      qq3   = q3 * C3;
      qq4   = q4coef * c2;
      rkin1 = -qq1 - qq2 + TWO * qq3 + qq4;
      rkin2 = qq1 - qq2 - qq4;

      /* Set vertical diffusion terms. */

      c1dn   = IJKth(udata, 1, jx, jy + idn);
      c2dn   = IJKth(udata, 2, jx, jy + idn);
      c1up   = IJKth(udata, 1, jx, jy + iup);
      c2up   = IJKth(udata, 2, jx, jy + iup);
      vertd1 = cyup * (c1up - c1) - cydn * (c1 - c1dn);
      vertd2 = cyup * (c2up - c2) - cydn * (c2 - c2dn);

      /* Set horizontal diffusion and advection terms. */

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;
      c1lt   = IJKth(udata, 1, jx + ileft, jy);
      c2lt   = IJKth(udata, 2, jx + ileft, jy);
      c1rt   = IJKth(udata, 1, jx + iright, jy);
      c2rt   = IJKth(udata, 2, jx + iright, jy);
      hord1  = hordco * (c1rt - TWO * c1 + c1lt);
      hord2  = hordco * (c2rt - TWO * c2 + c2lt);
      horad1 = horaco * (c1rt - c1lt);
      horad2 = horaco * (c2rt - c2lt);

      /* Load all terms into udot. */

      IJKth(dudata, 1, jx, jy) = vertd1 + hord1 + horad1 + rkin1;
      IJKth(dudata, 2, jx, jy) = vertd2 + hord2 + horad2 + rkin2;
    }
  }

  return (0);
}